

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestTest.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_2ec4d::TestPassingTestHasNoFailures::RunImpl(TestPassingTestHasNoFailures *this)

{
  TestResults *results_00;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  ScopedCurrentTest scopedResults;
  TestResults results;
  int local_6c;
  ScopedCurrentTest local_68;
  Test local_58;
  TestResults local_20;
  
  UnitTest::TestResults::TestResults(&local_20,(TestReporter *)0x0);
  ppTVar1 = UnitTest::CurrentTest::Results();
  local_68.m_oldTestResults = *ppTVar1;
  ppTVar2 = UnitTest::CurrentTest::Details();
  local_68.m_oldTestDetails = *ppTVar2;
  ppTVar1 = UnitTest::CurrentTest::Results();
  *ppTVar1 = &local_20;
  UnitTest::Test::Test(&local_58,"passing","DefaultSuite","",0);
  local_58._vptr_Test = (_func_int **)&PTR__Test_00151440;
  UnitTest::Test::Run(&local_58);
  UnitTest::Test::~Test(&local_58);
  ScopedCurrentTest::~ScopedCurrentTest(&local_68);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results_00 = *ppTVar1;
  local_68.m_oldTestResults = (TestResults *)((ulong)local_68.m_oldTestResults & 0xffffffff00000000)
  ;
  local_6c = UnitTest::TestResults::GetFailureCount(&local_20);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails((TestDetails *)&local_58,*ppTVar2,0x1c);
  UnitTest::CheckEqual<int,int>(results_00,(int *)&local_68,&local_6c,(TestDetails *)&local_58);
  return;
}

Assistant:

TEST(PassingTestHasNoFailures)
{
    class PassingTest : public Test
    {
    public:
        PassingTest() : Test("passing") {}
        virtual void RunImpl() const
        {
            CHECK(true);
        }
    };

    TestResults results;
	{
		ScopedCurrentTest scopedResults(results);
		PassingTest().Run();
	}

    CHECK_EQUAL(0, results.GetFailureCount());
}